

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O3

void bswap_args(PDISASM pMyDisasm,int index)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  int iVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  UInt8 UVar10;
  char (*pacVar11) [8];
  long lVar12;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
    (pMyDisasm->Operand1).AccessMode = 0;
    (pMyDisasm->Operand2).AccessMode = 0;
    (pMyDisasm->Operand3).AccessMode = 0;
    (pMyDisasm->Operand4).AccessMode = 0;
    (pMyDisasm->Operand5).AccessMode = 0;
    (pMyDisasm->Operand6).AccessMode = 0;
    (pMyDisasm->Operand7).AccessMode = 0;
    (pMyDisasm->Operand8).AccessMode = 0;
    (pMyDisasm->Operand9).AccessMode = 0;
    (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
    return;
  }
  (pMyDisasm->Instruction).Category = 0x10001;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"bswap",6);
  iVar3 = (pMyDisasm->Reserved_).OperandSize;
  if (iVar3 == 0x20) {
    (pMyDisasm->Operand1).OpSize = 0x20;
    if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
      pacVar11 = Registers32Bits;
LAB_0013f009:
      lVar12 = (long)index;
      pacVar11 = pacVar11 + lVar12;
      goto LAB_0013f00d;
    }
    pacVar11 = Registers32Bits;
LAB_0013efd5:
    pacVar11 = pacVar11 + (long)index + 8;
  }
  else {
    if (iVar3 != 0x40) {
      (pMyDisasm->Operand1).OpSize = 0x10;
      if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
        pacVar11 = Registers16Bits;
        goto LAB_0013f009;
      }
      pacVar11 = Registers16Bits;
      goto LAB_0013efd5;
    }
    (pMyDisasm->Operand1).OpSize = 0x40;
    if ((pMyDisasm->Reserved_).REX.B_ != '\x01') {
      lVar12 = (long)index;
      pacVar11 = (char (*) [8])(Registers64Bits + lVar12);
      goto LAB_0013f00d;
    }
    pacVar11 = (char (*) [8])(Registers64Bits + (long)index + 8);
  }
  lVar12 = (long)index + 8;
LAB_0013f00d:
  strcpy((pMyDisasm->Operand1).OpMnemonic,*pacVar11);
  (pMyDisasm->Operand1).OpType = 0x20000;
  (pMyDisasm->Operand1).Registers.type = 1;
  (pMyDisasm->Operand1).Registers.gpr = REGS[lVar12];
  (pMyDisasm->Operand1).AccessMode = 3;
  (pMyDisasm->Reserved_).EIP_ = (pMyDisasm->Reserved_).EIP_ + 1;
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar4 = EFLAGS_TABLE[10].NT_;
  UVar5 = EFLAGS_TABLE[10].RF_;
  UVar6 = EFLAGS_TABLE[10].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[10].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar4;
  (pMyDisasm->Instruction).Flags.RF_ = UVar5;
  (pMyDisasm->Instruction).Flags.alignment = UVar6;
  UVar4 = EFLAGS_TABLE[10].SF_;
  UVar5 = EFLAGS_TABLE[10].ZF_;
  UVar6 = EFLAGS_TABLE[10].AF_;
  UVar7 = EFLAGS_TABLE[10].PF_;
  UVar8 = EFLAGS_TABLE[10].CF_;
  UVar9 = EFLAGS_TABLE[10].TF_;
  UVar10 = EFLAGS_TABLE[10].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[10].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar4;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar5;
  (pMyDisasm->Instruction).Flags.AF_ = UVar6;
  (pMyDisasm->Instruction).Flags.PF_ = UVar7;
  (pMyDisasm->Instruction).Flags.CF_ = UVar8;
  (pMyDisasm->Instruction).Flags.TF_ = UVar9;
  (pMyDisasm->Instruction).Flags.IF_ = UVar10;
  return;
}

Assistant:

void __bea_callspec__ bswap_args(PDISASM pMyDisasm, int index)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+DATA_TRANSFER;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "bswap");
  #endif
  if (GV.OperandSize == 64) {
    pMyDisasm->Operand1.OpSize = 64;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers64Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  else if (GV.OperandSize == 32){
    pMyDisasm->Operand1.OpSize = 32;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers32Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  else {
    pMyDisasm->Operand1.OpSize = 16;
    if (GV.REX.B_ == 1) {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index+8]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+8];
    }
    else {
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) strcpy ((char*) pMyDisasm->Operand1.OpMnemonic, Registers16Bits[index+0]);
      #endif
      pMyDisasm->Operand1.OpType = REGISTER_TYPE;
      pMyDisasm->Operand1.Registers.type = GENERAL_REG;
      pMyDisasm->Operand1.Registers.gpr = REGS[index+0];
    }
  }
  pMyDisasm->Operand1.AccessMode = READ + WRITE;
  GV.EIP_++;
  FillFlags(pMyDisasm,10);
}